

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

PLTermBuilder __thiscall
mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm
          (BasicExprFactory<std::allocator<char>_> *this,int num_breakpoints)

{
  SafeInt<int> n;
  AssertionFailure *this_00;
  Impl *impl_00;
  int in_ESI;
  Impl *impl;
  SafeInt<int> size;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  SafeInt<int> in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc8;
  SafeInt<int> in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  PLTermBuilder local_10;
  
  if (in_ESI < 1) {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    __cxa_throw(this_00,&AssertionFailure::typeinfo,AssertionFailure::~AssertionFailure);
  }
  SafeInt<int>::SafeInt((SafeInt<int> *)&stack0xffffffffffffffd0,0x10);
  n = mp::operator*(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  mp::val(n);
  impl_00 = Allocate<mp::PLTerm>
                      ((BasicExprFactory<std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0.value_),
                       (Kind)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                       (int)in_stack_ffffffffffffffc8);
  impl_00->num_breakpoints = in_ESI;
  PLTermBuilder::PLTermBuilder(&local_10,impl_00);
  return local_10;
}

Assistant:

PLTermBuilder BeginPLTerm(int num_breakpoints) {
    MP_ASSERT(num_breakpoints > 0, "invalid number of breakpoints");
    SafeInt<int> size = sizeof(double) * 2;
    PLTerm::Impl *impl = Allocate<PLTerm>(
          expr::PLTERM, val(size * num_breakpoints));
    impl->num_breakpoints = num_breakpoints;
    return PLTermBuilder(impl);
  }